

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void MultiplyRow_16_AVX2(uint16_t *src_y,uint16_t *dst_y,int scale,int width)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  long lVar6;
  undefined1 auVar7 [32];
  
  auVar2 = vpunpcklwd_avx(ZEXT416((uint)scale),ZEXT416((uint)scale));
  auVar7._0_4_ = auVar2._0_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  auVar7._16_4_ = auVar7._0_4_;
  auVar7._20_4_ = auVar7._0_4_;
  auVar7._24_4_ = auVar7._0_4_;
  auVar7._28_4_ = auVar7._0_4_;
  lVar6 = (long)dst_y - (long)src_y;
  do {
    auVar3 = vpmullw_avx2(*(undefined1 (*) [32])src_y,auVar7);
    auVar4 = vpmullw_avx2(*(undefined1 (*) [32])((long)src_y + 0x20),auVar7);
    *(undefined1 (*) [32])((long)src_y + lVar6) = auVar3;
    *(undefined1 (*) [32])((long)src_y + lVar6 + 0x20) = auVar4;
    src_y = (uint16_t *)((long)src_y + 0x40);
    iVar5 = width + -0x20;
    bVar1 = 0x1f < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar1);
  return;
}

Assistant:

void MultiplyRow_16_AVX2(const uint16_t* src_y,
                         uint16_t* dst_y,
                         int scale,
                         int width) {
  // clang-format off
  asm volatile (
      "vmovd       %3,%%xmm3                     \n"
      "vpunpcklwd  %%xmm3,%%xmm3,%%xmm3          \n"
      "vbroadcastss %%xmm3,%%ymm3                \n"
      "sub         %0,%1                         \n"

    // 16 pixels per loop.
    LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "vpmullw     %%ymm3,%%ymm0,%%ymm0          \n"
      "vpmullw     %%ymm3,%%ymm1,%%ymm1          \n"
      "vmovdqu     %%ymm0,(%0,%1)                \n"
      "vmovdqu     %%ymm1,0x20(%0,%1)            \n"
      "add         $0x40,%0                      \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
  : "+r"(src_y),   // %0
    "+r"(dst_y),   // %1
    "+r"(width)    // %2
  : "r"(scale)     // %3
  : "memory", "cc", "xmm0", "xmm1", "xmm3");
  // clang-format on
}